

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

char * nni_http_get_reason(nng_http *conn)

{
  char *local_18;
  nng_http *conn_local;
  
  if (conn->rsn == (char *)0x0) {
    local_18 = nni_http_reason(conn->code);
  }
  else {
    local_18 = conn->rsn;
  }
  return local_18;
}

Assistant:

const char *
nni_http_get_reason(nng_http *conn)
{
	return (conn->rsn ? conn->rsn : nni_http_reason(conn->code));
}